

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_2::initProgramsFillCoverCase
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *this;
  char *pcVar3;
  allocator<char> local_221;
  string local_220;
  string local_200;
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [40];
  ostringstream src;
  
  CaseDefinition::CaseDefinition((CaseDefinition *)local_1b8,caseDef);
  initCommonPrograms(programCollection,(CaseDefinition *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  if ((ulong)caseDef->primitiveType < 3) {
    pcVar1 = *(char **)(&DAT_00c08938 + (ulong)caseDef->primitiveType * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", ");
  if ((ulong)caseDef->spacingMode < 3) {
    pcVar1 = (&PTR_anon_var_dwarf_fe2586_00c08950)[caseDef->spacingMode];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec2 in_te_position[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 in_f_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  pcVar1 = "";
  if (caseDef->primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar1 = 
    "    highp vec2 corner0 = in_te_position[0];\n    highp vec2 corner1 = in_te_position[1];\n    highp vec2 corner2 = in_te_position[2];\n    highp vec2 corner3 = in_te_position[3];\n    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n    highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n    highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n    gl_Position = vec4(pos, 0.0, 1.0);\n"
    ;
  }
  pcVar3 = 
  "    highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n    highp vec2 corner0 = in_te_position[0];\n    highp vec2 corner1 = in_te_position[1];\n    highp vec2 corner2 = in_te_position[2];\n    highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n    highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n    gl_Position = vec4(pos, 0.0, 1.0);\n"
  ;
  if (caseDef->primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar3 = pcVar1;
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"    in_f_color = vec4(1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"tese",&local_221);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add
                   (&programCollection->glslSources,&local_200);
  std::__cxx11::stringbuf::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1e0,&local_220);
  glu::ProgramSources::operator<<(this,(ShaderSource *)local_1e0);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initProgramsFillCoverCase (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES || caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS);

	initCommonPrograms(programCollection, caseDef);

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ") in;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_te_position[];\n"
			<< "layout(location = 0) out highp vec4 in_f_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<<	(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
					"    highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n"
					"    highp vec2 corner0 = in_te_position[0];\n"
					"    highp vec2 corner1 = in_te_position[1];\n"
					"    highp vec2 corner2 = in_te_position[2];\n"
					"    highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n"
					"    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n"
					"    highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n"
					"    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
					"    gl_Position = vec4(pos, 0.0, 1.0);\n"
				: caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ?
					"    highp vec2 corner0 = in_te_position[0];\n"
					"    highp vec2 corner1 = in_te_position[1];\n"
					"    highp vec2 corner2 = in_te_position[2];\n"
					"    highp vec2 corner3 = in_te_position[3];\n"
					"    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
					"                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
					"                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
					"                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
					"    highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n"
					"    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n"
					"    highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n"
					"    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
					"    gl_Position = vec4(pos, 0.0, 1.0);\n"
				: "")
			<< "    in_f_color = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}